

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O2

bool __thiscall
gguf_reader::read<unsigned_long>
          (gguf_reader *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *dst,size_t n)

{
  pointer puVar1;
  bool bVar2;
  unsigned_long *dst_00;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(dst,n);
  uVar5 = 0xffffffffffffffff;
  lVar3 = 0;
  do {
    puVar1 = (dst->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = (long)(dst->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)puVar1 >> 3;
    uVar5 = uVar5 + 1;
    if (uVar4 <= uVar5) break;
    dst_00 = (unsigned_long *)((long)puVar1 + lVar3);
    lVar3 = lVar3 + 8;
    bVar2 = read<unsigned_long>(this,dst_00);
  } while (bVar2);
  return uVar4 <= uVar5;
}

Assistant:

bool read(std::vector<T> & dst, const size_t n) const {
        dst.resize(n);
        for (size_t i = 0; i < dst.size(); ++i) {
            if constexpr (std::is_same<T, bool>::value) {
                bool tmp;
                if (!read(tmp)) {
                    return false;
                }
                dst[i] = tmp;
            } else {
                if (!read(dst[i])) {
                    return false;
                }
            }
        }
        return true;
    }